

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
irwincolor::Map::map
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,Map *this,
          double y)

{
  allocator<float> *paVar1;
  pointer *ppfVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  pointer pfVar6;
  bool bVar7;
  int iVar8;
  reference pvVar9;
  double *__a;
  double *pdVar10;
  const_iterator cVar11;
  const_iterator __last;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  difference_type dVar12;
  const_reference pvVar13;
  reference pvVar14;
  pointer *ppfVar15;
  float extraout_XMM0_Da;
  double dVar16;
  double dVar17;
  double extraout_XMM0_Qa;
  uchar local_32b [3];
  iterator local_328;
  undefined8 local_320;
  uchar local_313 [3];
  iterator local_310;
  undefined8 local_308;
  uchar local_2fb;
  uchar local_2fa;
  uchar local_2f9;
  iterator local_2f8;
  undefined8 local_2f0;
  uchar local_2e3;
  uchar local_2e2;
  uchar local_2e1;
  iterator local_2e0;
  undefined8 local_2d8;
  uchar local_2cb;
  uchar local_2ca;
  undefined1 local_2c9;
  iterator local_2c8;
  undefined8 local_2c0;
  uchar local_2b3;
  uchar local_2b2;
  undefined1 local_2b1;
  iterator local_2b0;
  undefined8 local_2a8;
  uchar local_299;
  double dStack_298;
  uint8_t xu;
  double hp;
  uint8_t c;
  iterator puStack_288;
  undefined8 local_280;
  undefined1 local_278 [8];
  vector<float,_std::allocator<float>_> rgbf_2;
  undefined1 local_258 [8];
  vector<float,_std::allocator<float>_> hsv;
  vector<float,_std::allocator<float>_> hsv1;
  vector<float,_std::allocator<float>_> hsv0;
  undefined1 local_208 [8];
  vector<float,_std::allocator<float>_> rgb1_2;
  undefined1 local_1e8 [8];
  vector<float,_std::allocator<float>_> rgb0_2;
  vector<float,_std::allocator<float>_> rgbf_1;
  undefined1 local_1b0 [8];
  vector<float,_std::allocator<float>_> lab;
  vector<float,_std::allocator<float>_> lab1;
  vector<float,_std::allocator<float>_> lab0;
  undefined1 local_160 [8];
  vector<float,_std::allocator<float>_> rgb1_1;
  undefined1 local_140 [8];
  vector<float,_std::allocator<float>_> rgb0_1;
  vector<float,_std::allocator<float>_> rgbf;
  undefined1 local_108 [8];
  vector<float,_std::allocator<float>_> msh;
  vector<float,_std::allocator<float>_> msh1;
  vector<float,_std::allocator<float>_> msh0;
  undefined1 local_b8 [8];
  vector<float,_std::allocator<float>_> rgb1;
  undefined1 local_98 [8];
  vector<float,_std::allocator<float>_> rgb0;
  double f;
  int i;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> iter;
  double local_40 [3];
  allocator<unsigned_char> local_26;
  undefined1 local_25;
  undefined4 local_24;
  double dStack_20;
  float twofivesix;
  double y_local;
  Map *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rgb;
  
  local_24 = 0x437fffbe;
  local_25 = 0;
  dStack_20 = y;
  y_local = (double)this;
  this_local = (Map *)__return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_26);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,3,&local_26);
  std::allocator<unsigned_char>::~allocator(&local_26);
  if (dStack_20 <= 1.0) {
    local_40[0] = 0.0;
    __a = std::max<double>(&stack0xffffffffffffffe0,local_40);
    iter._M_current = (double *)0x3ff0000000000000;
    pdVar10 = std::min<double>(__a,(double *)&iter);
    iVar8 = (int)__a;
    dStack_20 = *pdVar10;
    if ((this->inv & 1U) != 0) {
      dStack_20 = 1.0 - dStack_20;
    }
    if ((this->paraView & 1U) == 0) {
      if ((this->imap < 0) || (2 < this->imap)) {
        if ((this->imap < 3) || (5 < this->imap)) {
          hp._4_1_ = 0xff;
          dStack_298 = dStack_20 * 6.0;
          fmod(dStack_298,2.0);
          std::abs(iVar8);
          local_32b[2] = (uchar)(int)((1.0 - extraout_XMM0_Qa) * 255.99899291992188);
          local_299 = local_32b[2];
          if (1.0 <= dStack_298) {
            if (2.0 <= dStack_298) {
              if (3.0 <= dStack_298) {
                if (4.0 <= dStack_298) {
                  if (5.0 <= dStack_298) {
                    local_32b[0] = hp._4_1_;
                    local_32b[1] = 0;
                    local_328 = local_32b;
                    local_320 = 3;
                    __l._M_len = 3;
                    __l._M_array = local_328;
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                              (__return_storage_ptr__,__l);
                  }
                  else {
                    local_313[1] = 0;
                    local_313[2] = hp._4_1_;
                    local_310 = local_313;
                    local_308 = 3;
                    __l_00._M_len = 3;
                    __l_00._M_array = local_310;
                    local_313[0] = local_32b[2];
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                              (__return_storage_ptr__,__l_00);
                  }
                }
                else {
                  local_2fb = '\0';
                  local_2f9 = hp._4_1_;
                  local_2f8 = &local_2fb;
                  local_2f0 = 3;
                  __l_01._M_len = 3;
                  __l_01._M_array = local_2f8;
                  local_2fa = local_32b[2];
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                            (__return_storage_ptr__,__l_01);
                }
              }
              else {
                local_2e3 = '\0';
                local_2e2 = hp._4_1_;
                local_2e0 = &local_2e3;
                local_2d8 = 3;
                __l_02._M_len = 3;
                __l_02._M_array = local_2e0;
                local_2e1 = local_32b[2];
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          (__return_storage_ptr__,__l_02);
              }
            }
            else {
              local_2ca = hp._4_1_;
              local_2c9 = 0;
              local_2c8 = &local_2cb;
              local_2c0 = 3;
              __l_03._M_len = 3;
              __l_03._M_array = local_2c8;
              local_2cb = local_32b[2];
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (__return_storage_ptr__,__l_03);
            }
          }
          else {
            local_2b3 = hp._4_1_;
            local_2b1 = 0;
            local_2b0 = &local_2b3;
            local_2a8 = 3;
            __l_04._M_len = 3;
            __l_04._M_array = local_2b0;
            local_2b2 = local_32b[2];
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (__return_storage_ptr__,__l_04);
          }
        }
        else {
          hp._5_1_ = 0xff;
          hp._6_1_ = 0xff;
          hp._7_1_ = 0xff;
          puStack_288 = (iterator)((long)&hp + 5);
          local_280 = 3;
          __l_05._M_len = 3;
          __l_05._M_array = puStack_288;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (__return_storage_ptr__,__l_05);
          dVar16 = dStack_20 * 255.99899291992188;
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (__return_storage_ptr__,(long)(this->imap + -3));
          *pvVar9 = (value_type)(int)dVar16;
        }
      }
      else {
        dVar16 = dStack_20 * 255.99899291992188;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,(long)this->imap);
        *pvVar9 = (value_type)(int)dVar16;
      }
    }
    else {
      cVar11 = std::vector<double,_std::allocator<double>_>::begin(&this->x);
      __last = std::vector<double,_std::allocator<double>_>::end(&this->x);
      __last_00 = std::
                  lower_bound<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                            (cVar11._M_current,__last._M_current,&stack0xffffffffffffffe0);
      cVar11 = std::vector<double,_std::allocator<double>_>::begin(&this->x);
      dVar12 = std::
               distance<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                         ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                           )cVar11._M_current,__last_00);
      dVar16 = dStack_20;
      iVar8 = (int)dVar12;
      if (iVar8 < 1) {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->r,(long)iVar8);
        dVar16 = *pvVar13;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0);
        *pvVar9 = (value_type)(int)(dVar16 * 255.99899291992188);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->g,(long)iVar8);
        dVar16 = *pvVar13;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,1);
        *pvVar9 = (value_type)(int)(dVar16 * 255.99899291992188);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->b,(long)iVar8);
        dVar16 = *pvVar13;
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,2);
        *pvVar9 = (value_type)(int)(dVar16 * 255.99899291992188);
      }
      else {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->x,(long)(iVar8 + -1));
        dVar5 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->x,(long)iVar8);
        dVar17 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            (&this->x,(long)(iVar8 + -1));
        rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)((dVar16 - dVar5) / (dVar17 - *pvVar13));
        bVar7 = std::operator==(&this->space,"Diverging");
        if (bVar7) {
          paVar1 = (allocator<float> *)
                   ((long)&rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<float>::allocator(paVar1);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_98,3,paVar1);
          std::allocator<float>::~allocator
                    ((allocator<float> *)
                     ((long)&rgb1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&this->r,(long)(iVar8 + -1));
          dVar16 = *pvVar13;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_98,0);
          *pvVar14 = (float)dVar16;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&this->g,(long)(iVar8 + -1));
          dVar16 = *pvVar13;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_98,1);
          *pvVar14 = (float)dVar16;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              (&this->b,(long)(iVar8 + -1));
          dVar16 = *pvVar13;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_98,2);
          *pvVar14 = (float)dVar16;
          paVar1 = (allocator<float> *)
                   ((long)&msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<float>::allocator(paVar1);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_b8,3,paVar1);
          std::allocator<float>::~allocator
                    ((allocator<float> *)
                     ((long)&msh0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->r,(long)iVar8);
          dVar16 = *pvVar13;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b8,0);
          *pvVar14 = (float)dVar16;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->g,(long)iVar8);
          dVar16 = *pvVar13;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b8,1);
          *pvVar14 = (float)dVar16;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->b,(long)iVar8);
          dVar16 = *pvVar13;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_b8,2);
          *pvVar14 = (float)dVar16;
          rgb2msh((vector<float,_std::allocator<float>_> *)
                  &msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<float,_std::allocator<float>_> *)local_98);
          rgb2msh((vector<float,_std::allocator<float>_> *)
                  &msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<float,_std::allocator<float>_> *)local_b8);
          std::vector<float,_std::allocator<float>_>::operator[]
                    ((vector<float,_std::allocator<float>_> *)
                     &msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,2);
          ppfVar15 = &msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          std::vector<float,_std::allocator<float>_>::operator[]
                    ((vector<float,_std::allocator<float>_> *)ppfVar15,2);
          std::abs((int)ppfVar15);
          if (pi < (double)extraout_XMM0_Da) {
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)
                                 &msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,2);
            fVar3 = *pvVar14;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)
                                 &msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,2);
            dVar16 = pi;
            if (*pvVar14 <= fVar3) {
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)
                                   &msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,2);
              *pvVar14 = (float)(dVar16 + dVar16 + (double)*pvVar14);
            }
            else {
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)
                                   &msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,2);
              *pvVar14 = (float)(dVar16 + dVar16 + (double)*pvVar14);
            }
          }
          paVar1 = (allocator<float> *)
                   ((long)&rgbf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<float>::allocator(paVar1);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_108,3,paVar1);
          std::allocator<float>::~allocator
                    ((allocator<float> *)
                     ((long)&rgbf.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          ppfVar15 = &msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar15,0);
          pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          fVar3 = *pvVar14;
          ppfVar2 = &msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,0);
          fVar4 = *pvVar14;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_108,0);
          *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
          dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar15,1);
          pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          fVar3 = *pvVar14;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,1);
          fVar4 = *pvVar14;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_108,1);
          *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
          dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar15,2);
          pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          fVar3 = *pvVar14;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,2);
          fVar4 = *pvVar14;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)local_108,2);
          *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
          msh2rgb((vector<float,_std::allocator<float>_> *)
                  &rgb0_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                  (vector<float,_std::allocator<float>_> *)local_108);
          ppfVar15 = &rgb0_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar15,0);
          fVar3 = *pvVar14;
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (__return_storage_ptr__,0);
          *pvVar9 = (value_type)(int)(fVar3 * 255.999);
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar15,1);
          fVar3 = *pvVar14;
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (__return_storage_ptr__,1);
          *pvVar9 = (value_type)(int)(fVar3 * 255.999);
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar15,2);
          fVar3 = *pvVar14;
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (__return_storage_ptr__,2);
          *pvVar9 = (value_type)(int)(fVar3 * 255.999);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &rgb0_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_108);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &msh.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)
                     &msh1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_b8);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_98);
        }
        else {
          bVar7 = std::operator==(&this->space,"Lab");
          if (bVar7) {
            paVar1 = (allocator<float> *)
                     ((long)&rgb1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7);
            std::allocator<float>::allocator(paVar1);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_140,3,paVar1);
            std::allocator<float>::~allocator
                      ((allocator<float> *)
                       ((long)&rgb1_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->r,(long)(iVar8 + -1));
            dVar16 = *pvVar13;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_140,0);
            *pvVar14 = (float)dVar16;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->g,(long)(iVar8 + -1));
            dVar16 = *pvVar13;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_140,1);
            *pvVar14 = (float)dVar16;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                (&this->b,(long)(iVar8 + -1));
            dVar16 = *pvVar13;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_140,2);
            *pvVar14 = (float)dVar16;
            paVar1 = (allocator<float> *)
                     ((long)&lab0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7);
            std::allocator<float>::allocator(paVar1);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_160,3,paVar1);
            std::allocator<float>::~allocator
                      ((allocator<float> *)
                       ((long)&lab0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->r,(long)iVar8)
            ;
            dVar16 = *pvVar13;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_160,0);
            *pvVar14 = (float)dVar16;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->g,(long)iVar8)
            ;
            dVar16 = *pvVar13;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_160,1);
            *pvVar14 = (float)dVar16;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](&this->b,(long)iVar8)
            ;
            dVar16 = *pvVar13;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_160,2);
            *pvVar14 = (float)dVar16;
            rgb2lab((vector<float,_std::allocator<float>_> *)
                    &lab1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<float,_std::allocator<float>_> *)local_140);
            rgb2lab((vector<float,_std::allocator<float>_> *)
                    &lab.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<float,_std::allocator<float>_> *)local_160);
            paVar1 = (allocator<float> *)
                     ((long)&rgbf_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7);
            std::allocator<float>::allocator(paVar1);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_1b0,3,paVar1);
            std::allocator<float>::~allocator
                      ((allocator<float> *)
                       ((long)&rgbf_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
            dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage;
            ppfVar15 = &lab1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar15,0);
            pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            fVar3 = *pvVar14;
            ppfVar2 = &lab.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar2,0);
            fVar4 = *pvVar14;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_1b0,0);
            *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
            dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar15,1);
            pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            fVar3 = *pvVar14;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar2,1);
            fVar4 = *pvVar14;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_1b0,1);
            *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
            dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar15,2);
            pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            fVar3 = *pvVar14;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar2,2);
            fVar4 = *pvVar14;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_1b0,2);
            *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
            lab2rgb((vector<float,_std::allocator<float>_> *)
                    &rgb0_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<float,_std::allocator<float>_> *)local_1b0);
            ppfVar15 = &rgb0_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar15,0);
            fVar3 = *pvVar14;
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (__return_storage_ptr__,0);
            *pvVar9 = (value_type)(int)(fVar3 * 255.999);
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar15,1);
            fVar3 = *pvVar14;
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (__return_storage_ptr__,1);
            *pvVar9 = (value_type)(int)(fVar3 * 255.999);
            pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)ppfVar15,2);
            fVar3 = *pvVar14;
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (__return_storage_ptr__,2);
            *pvVar9 = (value_type)(int)(fVar3 * 255.999);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       &rgb0_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)local_1b0);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       &lab.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       &lab1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)local_160);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)local_140);
          }
          else {
            bVar7 = std::operator==(&this->space,"HSV");
            if (bVar7) {
              paVar1 = (allocator<float> *)
                       ((long)&rgb1_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7);
              std::allocator<float>::allocator(paVar1);
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)local_1e8,3,paVar1);
              std::allocator<float>::~allocator
                        ((allocator<float> *)
                         ((long)&rgb1_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 7));
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->r,(long)(iVar8 + -1));
              dVar16 = *pvVar13;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_1e8,0);
              *pvVar14 = (float)dVar16;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->g,(long)(iVar8 + -1));
              dVar16 = *pvVar13;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_1e8,1);
              *pvVar14 = (float)dVar16;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->b,(long)(iVar8 + -1));
              dVar16 = *pvVar13;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_1e8,2);
              *pvVar14 = (float)dVar16;
              paVar1 = (allocator<float> *)
                       ((long)&hsv0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7);
              std::allocator<float>::allocator(paVar1);
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)local_208,3,paVar1);
              std::allocator<float>::~allocator
                        ((allocator<float> *)
                         ((long)&hsv0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 7));
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->r,(long)iVar8);
              dVar16 = *pvVar13;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_208,0);
              *pvVar14 = (float)dVar16;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->g,(long)iVar8);
              dVar16 = *pvVar13;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_208,1);
              *pvVar14 = (float)dVar16;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->b,(long)iVar8);
              dVar16 = *pvVar13;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_208,2);
              *pvVar14 = (float)dVar16;
              rgb2hsv((vector<float,_std::allocator<float>_> *)
                      &hsv1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<float,_std::allocator<float>_> *)local_1e8);
              rgb2hsv((vector<float,_std::allocator<float>_> *)
                      &hsv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<float,_std::allocator<float>_> *)local_208);
              paVar1 = (allocator<float> *)
                       ((long)&rgbf_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7);
              std::allocator<float>::allocator(paVar1);
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)local_258,3,paVar1);
              std::allocator<float>::~allocator
                        ((allocator<float> *)
                         ((long)&rgbf_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 7));
              dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
              ppfVar15 = &hsv1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)ppfVar15,0);
              pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              fVar3 = *pvVar14;
              ppfVar2 = &hsv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)ppfVar2,0);
              fVar4 = *pvVar14;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_258,0);
              *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
              dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)ppfVar15,1);
              pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              fVar3 = *pvVar14;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)ppfVar2,1);
              fVar4 = *pvVar14;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_258,1);
              *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
              dVar16 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)ppfVar15,2);
              pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              fVar3 = *pvVar14;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)ppfVar2,2);
              fVar4 = *pvVar14;
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_258,2);
              *pvVar14 = (float)(dVar16 * (double)fVar3 + (double)pfVar6 * (double)fVar4);
              hsv2rgb((vector<float,_std::allocator<float>_> *)local_278,
                      (vector<float,_std::allocator<float>_> *)local_258);
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_278,0);
              fVar3 = *pvVar14;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (__return_storage_ptr__,0);
              *pvVar9 = (value_type)(int)(fVar3 * 255.999);
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_278,1);
              fVar3 = *pvVar14;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (__return_storage_ptr__,1);
              *pvVar9 = (value_type)(int)(fVar3 * 255.999);
              pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_278,2);
              fVar3 = *pvVar14;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (__return_storage_ptr__,2);
              *pvVar9 = (value_type)(int)(fVar3 * 255.999);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_278);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_258);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)
                         &hsv.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)
                         &hsv1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_208);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_1e8);
            }
            else {
              dVar17 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->r,(long)(iVar8 + -1));
              pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              dVar16 = *pvVar13;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->r,(long)iVar8);
              dVar5 = *pvVar13;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (__return_storage_ptr__,0);
              *pvVar9 = (value_type)
                        (int)((dVar17 * dVar16 + (double)pfVar6 * dVar5) * 255.99899291992188);
              dVar17 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->g,(long)(iVar8 + -1));
              pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              dVar16 = *pvVar13;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->g,(long)iVar8);
              dVar5 = *pvVar13;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (__return_storage_ptr__,1);
              *pvVar9 = (value_type)
                        (int)((dVar17 * dVar16 + (double)pfVar6 * dVar5) * 255.99899291992188);
              dVar17 = 1.0 - (double)rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->b,(long)(iVar8 + -1));
              pfVar6 = rgb0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              dVar16 = *pvVar13;
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (&this->b,(long)iVar8);
              dVar5 = *pvVar13;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (__return_storage_ptr__,2);
              *pvVar9 = (value_type)
                        (int)((dVar17 * dVar16 + (double)pfVar6 * dVar5) * 255.99899291992188);
            }
          }
        }
      }
    }
  }
  else {
    dVar16 = this->nanr;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,0);
    *pvVar9 = (value_type)(int)(dVar16 * 255.99899291992188);
    dVar16 = this->nang;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,1);
    *pvVar9 = (value_type)(int)(dVar16 * 255.99899291992188);
    dVar16 = this->nanb;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,2);
    *pvVar9 = (value_type)(int)(dVar16 * 255.99899291992188);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> map(double y) const
	{
		// "const" after the function name here means that this
		// method does not modify the class.

		// Almost, we need to floor result
		const float twofivesix = 255.999;

		// Map y in range [0, 1] (clipped if outside) to an RGB triple
		// in range [0, 255].

		std::vector<uint8_t> rgb(3);

		// Map out-of-range values to NaN color.
		if (y > 1.0)
		{
			rgb[0] = twofivesix * nanr;
			rgb[1] = twofivesix * nang;
			rgb[2] = twofivesix * nanb;
			return rgb;
		}

		y = std::min(std::max(y, 0.0), 1.0);

		if (inv)
			y = 1 - y;

		//// Note, using a function like sqrt here can skew the map
		//// towards the 255 end of the spectrum, while squaring can shift
		//// towards 0.
		//
		// TODO:  make an option for the exponent here.  It's useful for
		// things like black-to-red where the bright reds are
		// imperceptibly different from one another and a larger
		// exponent (e.g. 3 or 4) is helpful, while for HSV 1 is OK.
		//
		//y = sqrt(y);
		//y = y * y * y * y;
		if (paraView)
		{
			auto iter = std::lower_bound(x.begin(), x.end(), y);  // binary search
			int i = std::distance(x.begin(), iter);
			//std::cout << "i = " << i << "\n";
			//std::cout << "y = " << y << "\n";
			//std::cout << "iter = " << *iter << "\n";
			if (i > 0)
			{
				double f = (y - x[i-1]) / (x[i] - x[i-1]);
				if (space == "Diverging")
				{
					// TODO:  this may not be 100% correct, it's hard to
					// tell.  The adjustHue function described in the
					// reference may be required.  But there's only one
					// colormap in my XML files that uses this space
					// anyway.

					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto msh0 = rgb2msh(rgb0);
					auto msh1 = rgb2msh(rgb1);

					// Interpolating between an angle close to
					// +pi and an angle close to -pi should not
					// give a result near zero.
					if (abs(msh1[2] - msh0[2]) > pi)
					{
						if (msh0[2] < msh1[2])
							msh0[2] += 2 * pi;
						else
							msh1[2] += 2 * pi;
					}

					std::vector<float> msh(3);
					msh[0] = (1.0 - f) * msh0[0] + f * msh1[0];
					msh[1] = (1.0 - f) * msh0[1] + f * msh1[1];
					msh[2] = (1.0 - f) * msh0[2] + f * msh1[2];

					auto rgbf = msh2rgb(msh);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					////auto xyz0 = rgb2xyz(rgb0);
					////auto xyz  = msh2xyz(msh);
					////auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "msh0 = " << msh0 << std::endl;
					//std::cout << "msh  = " << msh  << std::endl;
					//std::cout << "msh1 = " << msh1 << std::endl;
					////std::cout << "xyz0 = " << xyz0 << std::endl;
					////std::cout << "xyz  = " << xyz  << std::endl;
					////std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "Lab")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto lab0 = rgb2lab(rgb0);
					auto lab1 = rgb2lab(rgb1);

					std::vector<float> lab(3);
					lab[0] = (1.0 - f) * lab0[0] + f * lab1[0];
					lab[1] = (1.0 - f) * lab0[1] + f * lab1[1];
					lab[2] = (1.0 - f) * lab0[2] + f * lab1[2];

					auto rgbf = lab2rgb(lab);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];

					//auto xyz0 = rgb2xyz(rgb0);
					//auto xyz  = lab2xyz(lab);
					//auto xyz1 = rgb2xyz(rgb1);
					//std::cout << "rgb0 = " << rgb0 << std::endl;
					//std::cout << "rgb  = " << (int) rgb[0] << " " << (int) rgb[1] << " " << (int) rgb[2] << std::endl;
					//std::cout << "rgbf = " << rgbf << std::endl;
					//std::cout << "rgb1 = " << rgb1 << std::endl;
					//std::cout << "lab0 = " << lab0 << std::endl;
					//std::cout << "lab  = " << lab  << std::endl;
					//std::cout << "lab1 = " << lab1 << std::endl;
					//std::cout << "xyz0 = " << xyz0 << std::endl;
					//std::cout << "xyz  = " << xyz  << std::endl;
					//std::cout << "xyz1 = " << xyz1 << std::endl;
					//std::cout << std::endl;
				}
				else if (space == "HSV")
				{
					std::vector<float> rgb0(3);
					rgb0[0] = r[i-1];
					rgb0[1] = g[i-1];
					rgb0[2] = b[i-1];

					std::vector<float> rgb1(3);
					rgb1[0] = r[i];
					rgb1[1] = g[i];
					rgb1[2] = b[i];

					auto hsv0 = rgb2hsv(rgb0);
					auto hsv1 = rgb2hsv(rgb1);

					std::vector<float> hsv(3);
					hsv[0] = (1.0 - f) * hsv0[0] + f * hsv1[0];
					hsv[1] = (1.0 - f) * hsv0[1] + f * hsv1[1];
					hsv[2] = (1.0 - f) * hsv0[2] + f * hsv1[2];

					auto rgbf = hsv2rgb(hsv);

					rgb[0] = twofivesix * rgbf[0];
					rgb[1] = twofivesix * rgbf[1];
					rgb[2] = twofivesix * rgbf[2];
				}
				else  // RGB
				{
					// TODO:  add a warning for unrecognized color spaces.
					rgb[0] = twofivesix * ((1.0 - f) * r[i-1] + f * r[i]);
					rgb[1] = twofivesix * ((1.0 - f) * g[i-1] + f * g[i]);
					rgb[2] = twofivesix * ((1.0 - f) * b[i-1] + f * b[i]);
				}
			}
			else
			{
				rgb[0] = twofivesix * r[i];
				rgb[1] = twofivesix * g[i];
				rgb[2] = twofivesix * b[i];
			}
		}
		else if (0 <= imap && imap < 3)
		{
			// Black-to-(red|green|blue) map
			//            0    1     2
			rgb[imap] = y * twofivesix;
		}
		else if (3 <= imap && imap < 6)
		{
			// (cyan|magenta|yellow)-to-white map
			//    3     4       5
			rgb = {twofivefive, twofivefive, twofivefive};
			rgb[imap - 3] = y * twofivesix;
		}
		else
		{
			// HSV
			uint8_t c = twofivefive;
			double hp = 6.0 * y;
			uint8_t xu = twofivesix * (1.0 - abs(fmod(hp, 2.0) - 1.0));
			if (hp < 1.0)
				rgb = {c, xu, 0};
			else if (hp < 2.0)
				rgb = {xu, c, 0};
			else if (hp < 3.0)
				rgb = {0, c, xu};
			else if (hp < 4.0)
				rgb = {0, xu, c};
			else if (hp < 5.0)
				rgb = {xu, 0, c};
			else
				rgb = {c, 0, xu};
		}

		//std::cout << "y = " << y << "\n";
		//std::cout << "rgb = " << rgb << "\n";

		return rgb;
	}